

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O2

TPZFMatrix<long_double> * __thiscall
TPZFMatrix<long_double>::operator*
          (TPZFMatrix<long_double> *__return_storage_ptr__,TPZFMatrix<long_double> *this,
          TPZFMatrix<long_double> *A)

{
  undefined8 in_R9;
  
  if ((this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol !=
      (A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow) {
    Error("Operator* <matrixs with incompatible dimensions>",(char *)0x0);
  }
  TPZFMatrix(__return_storage_ptr__);
  Redim(__return_storage_ptr__,(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow,
        (A->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol);
  (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x27]
  )(this,A,A,__return_storage_ptr__,0,in_R9,(longdouble)1,(longdouble)0);
  return __return_storage_ptr__;
}

Assistant:

inline TPZFMatrix<TVar> TPZFMatrix<TVar>::operator*(const TPZFMatrix<TVar> &A) const {
    if ( this->Cols() != A.Rows() )
        Error( "Operator* <matrixs with incompatible dimensions>" );
    
    TPZFMatrix<TVar> res;
    res.Redim( this->Rows(), A.Cols() );
    MultAdd(A,A,res,1.,0.,0);
    return( res );
}